

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O2

void EPD_DrawBitmap(uint16_t Xpos,uint16_t Ypos,uint16_t *bmp)

{
  ushort uVar1;
  long lVar2;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 0x19c; lVar3 = lVar3 + 1) {
    for (lVar2 = 0; lVar2 != 0x226; lVar2 = lVar2 + 1) {
      uVar1 = bmp[lVar2];
      EPD_DrawPixel((uint16_t)lVar2,(uint16_t)lVar3,
                    (uint8_t)((ulong)((uVar1 & 0x1f) * 0x390 +
                                      (uVar1 >> 3 & 0xfc) * 0x24b + (uVar1 >> 8 & 0xfffffff8) * 299
                                     + 500) / 1000));
    }
    bmp = bmp + 0x226;
  }
  return;
}

Assistant:

void EPD_DrawBitmap(uint16_t Xpos, uint16_t Ypos,uint16_t *bmp)
{
	uint16_t i,j;
	uint16_t R,G,B,temp;
	double Gray;

	for (j=0;j<412;j++)
	{
		for (i=0;i<550;i++)
		{
			temp = bmp[j*550+i];
			R = (temp >> 11)<<3;
			G = ((temp&0x07E0) >> 5)<<2;
			B = (temp&0x01F)<<3;
			Gray = (R*299 + G*587 + B*114 + 500) / 1000;
			EPD_DrawPixel(i, j,(uint8_t)Gray);
		}	
	}
}